

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_map_blck(Parser *this)

{
  char cVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  csubstr s_00;
  csubstr val;
  bool bVar16;
  undefined1 uVar17;
  int iVar18;
  State *pSVar19;
  uint uVar20;
  long lVar21;
  size_t sVar22;
  char *pcVar23;
  size_t ahead;
  csubstr fmt;
  ro_substr chars;
  ro_substr chars_00;
  csubstr rem;
  bool is_quoted;
  char msg [30];
  csubstr s;
  bool local_239;
  csubstr local_238;
  basic_substring<const_char> local_228;
  undefined6 uStack_218;
  undefined1 uStack_212;
  undefined1 uStack_211;
  undefined6 uStack_210;
  undefined1 uStack_20a;
  undefined4 uStack_209;
  undefined5 uStack_205;
  undefined2 uStack_200;
  undefined1 uStack_1fe;
  undefined5 uStack_1fd;
  undefined2 uStack_1f8;
  undefined1 uStack_1f6;
  undefined7 uStack_1f5;
  undefined1 uStack_1ee;
  csubstr local_1e8;
  undefined8 local_1d8;
  char *pcStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  pSVar19 = this->m_state;
  local_238.str = (pSVar19->line_contents).rem.str;
  local_238.len = (pSVar19->line_contents).rem.len;
  uVar20 = pSVar19->flags;
  if ((uVar20 & 4) == 0) {
    uStack_218 = 0x6c6c615f7361;
    uStack_212 = 0x28;
    uStack_211 = 0x52;
    uStack_210 = 0x292950414d;
    local_228.str = (char *)0x6166206b63656863;
    local_228.len._0_6_ = 0x203a64656c69;
    local_228.len._6_1_ = 0x28;
    local_228.len._7_1_ = 0x68;
    if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
      pcVar2 = (code *)swi(3);
      uVar17 = (*pcVar2)();
      return (bool)uVar17;
    }
    local_58 = 0;
    uStack_50 = 0x703e;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x703e) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x703e) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_228,0x1e,LVar3,(this->m_stack).m_callbacks.m_user_data);
    uVar20 = this->m_state->flags;
  }
  if ((uVar20 & 0x10) != 0) {
    uStack_218 = 0x6e6f6e5f7361;
    uStack_212 = 0x65;
    uStack_211 = 0x28;
    uStack_210 = 0x2929574f4c46;
    uStack_20a = 0;
    local_228.str = (char *)0x6166206b63656863;
    local_228.len._0_6_ = 0x203a64656c69;
    local_228.len._6_1_ = 0x28;
    local_228.len._7_1_ = 0x68;
    if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
      pcVar2 = (code *)swi(3);
      uVar17 = (*pcVar2)();
      return (bool)uVar17;
    }
    local_80 = 0;
    uStack_78 = 0x703f;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x703f) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x703f) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_228,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((local_238.len != 0) && (*local_238.str == '#')) {
    _scan_comment(this);
    return true;
  }
  pSVar19 = this->m_state;
  uVar20 = pSVar19->flags;
  if ((uVar20 >> 8 & 1) != 0) {
    if ((uVar20 & 0x40) != 0) {
      uStack_218 = 0x6e6f6e5f7361;
      uStack_212 = 0x65;
      uStack_211 = 0x28;
      uStack_210 = 0x292959454b52;
      uStack_20a = 0;
      local_228.str = (char *)0x6166206b63656863;
      local_228.len._0_6_ = 0x203a64656c69;
      local_228.len._6_1_ = 0x28;
      local_228.len._7_1_ = 0x68;
      if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar2 = (code *)swi(3);
        uVar17 = (*pcVar2)();
        return (bool)uVar17;
      }
      local_a8 = 0;
      uStack_a0 = 0x704a;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x704a) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x704a) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_228,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
      pSVar19 = this->m_state;
      uVar20 = pSVar19->flags;
    }
    if ((char)uVar20 < '\0') {
      uStack_218 = 0x6e6f6e5f7361;
      uStack_212 = 0x65;
      uStack_211 = 0x28;
      uStack_210 = 0x29294c415652;
      uStack_20a = 0;
      local_228.str = (char *)0x6166206b63656863;
      local_228.len._0_6_ = 0x203a64656c69;
      local_228.len._6_1_ = 0x28;
      local_228.len._7_1_ = 0x68;
      if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar2 = (code *)swi(3);
        uVar17 = (*pcVar2)();
        return (bool)uVar17;
      }
      local_d0 = 0;
      uStack_c8 = 0x704b;
      local_c0 = 0;
      pcStack_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_b0 = 0x65;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x704b) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x704b) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_228,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
      pSVar19 = this->m_state;
      uVar20 = pSVar19->flags;
    }
    pSVar19->flags = uVar20 & 0xfffffebf | 0x40;
  }
  bVar16 = _handle_indentation(this);
  if (bVar16) {
    return true;
  }
  uVar20 = this->m_state->flags;
  if ((uVar20 & 0x40) != 0) {
    if ((uVar20 >> 8 & 1) != 0) {
      uStack_218 = 0x6e6f6e5f7361;
      uStack_212 = 0x65;
      uStack_211 = 0x28;
      uStack_210 = 0x292954584e52;
      uStack_20a = 0;
      local_228.str = (char *)0x6166206b63656863;
      local_228.len._0_6_ = 0x203a64656c69;
      local_228.len._6_1_ = 0x28;
      local_228.len._7_1_ = 0x68;
      if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar2 = (code *)swi(3);
        uVar17 = (*pcVar2)();
        return (bool)uVar17;
      }
      local_f8 = 0;
      uStack_f0 = 0x7058;
      local_e8 = 0;
      pcStack_e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_d8 = 0x65;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7058) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x7058) << 0x40,8);
      LVar7.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_228,0x1f,LVar7,(this->m_stack).m_callbacks.m_user_data);
      uVar20 = this->m_state->flags;
    }
    if ((char)uVar20 < '\0') {
      uStack_218 = 0x6e6f6e5f7361;
      uStack_212 = 0x65;
      uStack_211 = 0x28;
      uStack_210 = 0x29294c415652;
      uStack_20a = 0;
      local_228.str = (char *)0x6166206b63656863;
      local_228.len._0_6_ = 0x203a64656c69;
      local_228.len._6_1_ = 0x28;
      local_228.len._7_1_ = 0x68;
      if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar2 = (code *)swi(3);
        uVar17 = (*pcVar2)();
        return (bool)uVar17;
      }
      local_120 = 0;
      uStack_118 = 0x7059;
      local_110 = 0;
      pcStack_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_100 = 0x65;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7059) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x7059) << 0x40,8);
      LVar8.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_228,0x1f,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar16 = _scan_scalar_map_blck(this,&local_238,&local_239);
    sVar22 = local_238.len;
    pcVar23 = local_238.str;
    if (bVar16) {
      if ((~this->m_state->flags & 0x220U) == 0) {
        pcVar23 = (this->m_buf).str;
        if ((local_238.str + -1 < pcVar23) || (pcVar23 + (this->m_buf).len < local_238.str + -1)) {
          uStack_1f8 = 0x7562;
          uStack_1f6 = 0x66;
          uStack_1f5 = 0x292928646e652e;
          uStack_1ee = 0;
          uStack_205 = 0x7320262620;
          uStack_200 = 0x7274;
          uStack_1fe = 0x20;
          uStack_1fd = 0x5f6d203d3c;
          uStack_218 = 0x203d3e207274;
          uStack_212 = 0x6d;
          uStack_211 = 0x5f;
          uStack_210 = 0x65622e667562;
          uStack_20a = 0x67;
          uStack_209 = 0x29286e69;
          local_228.str = (char *)0x6166206b63656863;
          local_228.len._0_6_ = 0x203a64656c69;
          local_228.len._6_1_ = 0x28;
          local_228.len._7_1_ = 0x73;
          if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar2 = (code *)swi(3);
            uVar17 = (*pcVar2)();
            return (bool)uVar17;
          }
          local_1e8.str = (char *)0x0;
          local_1e8.len = 0x5e96;
          local_1d8 = 0;
          pcStack_1d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1c8 = 0x65;
          LVar9.super_LineCol.col = 0;
          LVar9.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
          LVar9.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
          LVar9.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar9.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_228,0x3b,LVar9,(this->m_stack).m_callbacks.m_user_data);
        }
        _append_key_val(this,(csubstr)ZEXT816(0),0);
      }
      s_00.len = local_238.len;
      s_00.str = local_238.str;
      _store_scalar(this,s_00,(uint)local_239);
      pSVar19 = this->m_state;
      if ((~pSVar19->flags & 0x820U) == 0) {
        pcVar23 = (this->m_buf).str;
        if ((local_238.str < pcVar23) || (pcVar23 + (this->m_buf).len < local_238.str)) {
          uStack_1f8 = 0x7562;
          uStack_1f6 = 0x66;
          uStack_1f5 = 0x292928646e652e;
          uStack_1ee = 0;
          uStack_205 = 0x7320262620;
          uStack_200 = 0x7274;
          uStack_1fe = 0x20;
          uStack_1fd = 0x5f6d203d3c;
          uStack_218 = 0x203d3e207274;
          uStack_212 = 0x6d;
          uStack_211 = 0x5f;
          uStack_210 = 0x65622e667562;
          uStack_20a = 0x67;
          uStack_209 = 0x29286e69;
          local_228.str = (char *)0x6166206b63656863;
          local_228.len._0_6_ = 0x203a64656c69;
          local_228.len._6_1_ = 0x28;
          local_228.len._7_1_ = 0x73;
          if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar2 = (code *)swi(3);
            uVar17 = (*pcVar2)();
            return (bool)uVar17;
          }
          local_1e8.str = (char *)0x0;
          local_1e8.len = 0x5e96;
          local_1d8 = 0;
          pcStack_1d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1c8 = 0x65;
          LVar10.super_LineCol.col = 0;
          LVar10.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
          LVar10.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
          LVar10.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar10.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_228,0x3b,LVar10,(this->m_stack).m_callbacks.m_user_data);
        }
        _append_key_val(this,(csubstr)ZEXT816(0),0);
        pSVar19 = this->m_state;
      }
      local_238.str = (pSVar19->line_contents).rem.str;
      local_238.len = (pSVar19->line_contents).rem.len;
      if (local_238.len == 0) {
        return true;
      }
      if (*local_238.str != ':') {
        return true;
      }
      pSVar19->flags = pSVar19->flags & 0xffffff1fU | 0x80;
      _line_progressed(this,1);
      pSVar19 = this->m_state;
      local_238.str = (pSVar19->line_contents).rem.str;
      local_238.len = (pSVar19->line_contents).rem.len;
      if (local_238.len == 0) {
        return true;
      }
      if ((*local_238.str != ' ') && (*local_238.str != '\t')) {
        return true;
      }
      if ((pSVar19->line_contents).rem.str == (pSVar19->line_contents).full.str) {
        uStack_218 = 0x6c5f74615f20;
        uStack_212 = 0x69;
        uStack_211 = 0x6e;
        uStack_210 = 0x696765625f65;
        uStack_20a = 0x6e;
        local_228.str = (char *)0x6166206b63656863;
        local_228.len._0_6_ = 0x203a64656c69;
        local_228.len._6_1_ = 0x28;
        local_228.len._7_1_ = 0x21;
        uStack_209 = 0x292928;
        if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar2 = (code *)swi(3);
          uVar17 = (*pcVar2)();
          return (bool)uVar17;
        }
        local_148 = 0;
        uStack_140 = 0x7075;
        local_138 = 0;
        pcStack_130 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_128 = 0x65;
        LVar11.super_LineCol.col = 0;
        LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7075) << 0x40,0);
        LVar11.super_LineCol.line = SUB168(ZEXT816(0x7075) << 0x40,8);
        LVar11.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar11.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_228,0x23,LVar11,(this->m_stack).m_callbacks.m_user_data);
      }
      chars.len = 2;
      chars.str = " \t";
      sVar22 = basic_substring<const_char>::first_not_of(&local_238,chars,0);
      if ((sVar22 != 0xffffffffffffffff) && (local_238.len < sVar22)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar2 = (code *)swi(3);
          uVar17 = (*pcVar2)();
          return (bool)uVar17;
        }
        handle_error(0x24bbea,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar22 == 0xffffffffffffffff) {
        local_228.str = local_238.str;
        local_228.len._0_6_ = (undefined6)local_238.len;
        local_228.len._6_1_ = (undefined1)(local_238.len >> 0x30);
        local_228.len._7_1_ = (undefined1)(local_238.len >> 0x38);
      }
      else {
        basic_substring<const_char>::basic_substring(&local_228,local_238.str,sVar22);
      }
      sVar22 = CONCAT17(local_228.len._7_1_,CONCAT16(local_228.len._6_1_,(undefined6)local_228.len))
      ;
      local_238.str = local_228.str;
      local_238.len = sVar22;
      goto LAB_0021ce04;
    }
    if (local_238.len == 0) {
      iVar18 = basic_substring<const_char>::compare(&local_238,'?');
      if (iVar18 == 0) {
        ahead = 1;
LAB_0021c9af:
        _line_progressed(this,ahead);
        pSVar19 = this->m_state;
        uVar20 = pSVar19->flags;
        if ((uVar20 >> 9 & 1) != 0) {
          _append_key_val_null(this,local_238.str + -1);
          pSVar19 = this->m_state;
          uVar20 = pSVar19->flags;
        }
        uVar20 = uVar20 | 0x20;
        goto LAB_0021c9e2;
      }
      pSVar19 = this->m_state;
      uVar20 = pSVar19->flags;
      iVar18 = basic_substring<const_char>::compare(&local_238,':');
      if (iVar18 == 0) {
LAB_0021cd19:
        if ((uVar20 >> 9 & 1) == 0) {
          _store_scalar_null(this,local_238.str);
          pSVar19 = this->m_state;
          uVar20 = pSVar19->flags & 0xffffffdf;
          pSVar19->flags = uVar20;
        }
        pSVar19->flags = uVar20 & 0xffffff3f | 0x80;
        iVar18 = basic_substring<const_char>::compare(&local_238,':');
        sVar22 = 2 - (ulong)(iVar18 == 0);
        goto LAB_0021ce04;
      }
    }
    else {
      cVar1 = *local_238.str;
      if ((cVar1 == '\t') || (cVar1 == ' ')) {
        chars_00.len = 2;
        chars_00.str = " \t";
        sVar22 = basic_substring<const_char>::first_not_of(&local_238,chars_00,0);
        if (sVar22 == 0xffffffffffffffff) {
          sVar22 = local_238.len;
        }
        goto LAB_0021ce04;
      }
      iVar18 = basic_substring<const_char>::compare(&local_238,'?');
      if (iVar18 == 0) {
        ahead = 1;
        if (cVar1 != '?' || sVar22 == 1) goto LAB_0021c9af;
LAB_0021c9a1:
        ahead = (ulong)(pcVar23[1] == ' ') + 1;
        goto LAB_0021c9af;
      }
      if (cVar1 != '?' || sVar22 == 1) {
        pSVar19 = this->m_state;
        uVar20 = pSVar19->flags;
        if (((byte)uVar20 >> 5 & cVar1 == ':') != 0) {
          if ((uVar20 >> 9 & 1) == 0) {
            _store_scalar_null(this,pcVar23);
            pSVar19 = this->m_state;
            uVar20 = pSVar19->flags;
          }
          pSVar19->flags = uVar20 & 0xffffff1f | 0x80;
          _line_progressed(this,1);
          pSVar19 = this->m_state;
          local_238.str = (pSVar19->line_contents).rem.str;
          local_238.len = (pSVar19->line_contents).rem.len;
          if (local_238.len == 0) {
            return true;
          }
          if (*local_238.str != ' ') {
            return true;
          }
          if ((pSVar19->line_contents).rem.str == (pSVar19->line_contents).full.str) {
            uStack_218 = 0x6c5f74615f20;
            uStack_212 = 0x69;
            uStack_211 = 0x6e;
            uStack_210 = 0x696765625f65;
            uStack_20a = 0x6e;
            local_228.str = (char *)0x6166206b63656863;
            local_228.len._0_6_ = 0x203a64656c69;
            local_228.len._6_1_ = 0x28;
            local_228.len._7_1_ = 0x21;
            uStack_209 = 0x292928;
            if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
              pcVar2 = (code *)swi(3);
              uVar17 = (*pcVar2)();
              return (bool)uVar17;
            }
            local_170 = 0;
            uStack_168 = 0x7099;
            local_160 = 0;
            pcStack_158 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_150 = 0x65;
            LVar14.super_LineCol.col = 0;
            LVar14.super_LineCol.offset = SUB168(ZEXT816(0x7099) << 0x40,0);
            LVar14.super_LineCol.line = SUB168(ZEXT816(0x7099) << 0x40,8);
            LVar14.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar14.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_228,0x23,LVar14,(this->m_stack).m_callbacks.m_user_data);
            pSVar19 = this->m_state;
          }
          if (((pSVar19->line_contents).rem.len == 0) || (*(pSVar19->line_contents).rem.str != ' '))
          {
            uStack_1f8 = 0x775f;
            uStack_1f6 = 0x69;
            uStack_1f5 = 0x292963286874;
            uStack_205 = 0x65722e7374;
            uStack_200 = 0x2e6d;
            uStack_1fe = 0x62;
            uStack_1fd = 0x736e696765;
            uStack_218 = 0x65746174735f;
            uStack_212 = 0x2d;
            uStack_211 = 0x3e;
            uStack_210 = 0x635f656e696c;
            uStack_20a = 0x6f;
            uStack_209 = 0x6e65746e;
            local_228.str = (char *)0x6166206b63656863;
            local_228.len._0_6_ = 0x203a64656c69;
            local_228.len._6_1_ = 0x28;
            local_228.len._7_1_ = 0x6d;
            if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
              pcVar2 = (code *)swi(3);
              uVar17 = (*pcVar2)();
              return (bool)uVar17;
            }
            local_1e8.str = (char *)0x0;
            local_1e8.len = 0x6d66;
            local_1d8 = 0;
            pcStack_1d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_1c8 = 0x65;
            LVar15.super_LineCol.col = 0;
            LVar15.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
            LVar15.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
            LVar15.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar15.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      ((char *)&local_228,0x3a,LVar15,(this->m_stack).m_callbacks.m_user_data);
            pSVar19 = this->m_state;
          }
          sVar22 = basic_substring<const_char>::first_not_of(&(pSVar19->line_contents).rem,' ',0);
          if (sVar22 == 0xffffffffffffffff) {
            sVar22 = (this->m_state->line_contents).rem.len;
          }
          goto LAB_0021ce04;
        }
      }
      else {
        if (pcVar23[1] == ' ') goto LAB_0021c9a1;
        pSVar19 = this->m_state;
        uVar20 = pSVar19->flags;
      }
      iVar18 = basic_substring<const_char>::compare(&local_238,':');
      if ((iVar18 == 0) || (((sVar22 != 1 && (*local_238.str == ':')) && (local_238.str[1] == ' ')))
         ) goto LAB_0021cd19;
      if (2 < sVar22) {
        lVar21 = 0;
        do {
          if (local_238.str[lVar21] != "\t..."[lVar21 + 1]) {
            lVar21 = 0;
            goto LAB_0021ce9e;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
LAB_0021cf43:
        _end_stream(this);
        sVar22 = 3;
        goto LAB_0021ce04;
      }
    }
LAB_0021c817:
    bVar16 = _handle_types(this);
    if (bVar16) {
      return true;
    }
    bVar16 = _handle_key_anchors_and_refs(this);
    if (bVar16) {
      return true;
    }
    bVar16 = is_debugger_attached();
    if ((bVar16) && (bVar16 = is_debugger_attached(), bVar16)) {
      pcVar2 = (code *)swi(3);
      uVar17 = (*pcVar2)();
      return (bool)uVar17;
    }
LAB_0021c980:
    pcVar23 = "ERROR: parse error";
    sVar22 = 0x12;
LAB_0021bfdb:
    fmt.len = sVar22;
    fmt.str = pcVar23;
    _err<>(this,fmt);
    return false;
  }
  if (-1 < (char)uVar20) {
    bVar16 = is_debugger_attached();
    if ((bVar16) && (bVar16 = is_debugger_attached(), bVar16)) {
      pcVar2 = (code *)swi(3);
      uVar17 = (*pcVar2)();
      return (bool)uVar17;
    }
    pcVar23 = "ERROR: internal error";
    sVar22 = 0x15;
    goto LAB_0021bfdb;
  }
  if ((uVar20 >> 8 & 1) != 0) {
    uStack_218 = 0x6e6f6e5f7361;
    uStack_212 = 0x65;
    uStack_211 = 0x28;
    uStack_210 = 0x292954584e52;
    uStack_20a = 0;
    local_228.str = (char *)0x6166206b63656863;
    local_228.len._0_6_ = 0x203a64656c69;
    local_228.len._6_1_ = 0x28;
    local_228.len._7_1_ = 0x68;
    if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
      pcVar2 = (code *)swi(3);
      uVar17 = (*pcVar2)();
      return (bool)uVar17;
    }
    local_198 = 0;
    uStack_190 = 0x70c7;
    local_188 = 0;
    pcStack_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_178 = 0x65;
    LVar12.super_LineCol.col = 0;
    LVar12.super_LineCol.offset = SUB168(ZEXT816(0x70c7) << 0x40,0);
    LVar12.super_LineCol.line = SUB168(ZEXT816(0x70c7) << 0x40,8);
    LVar12.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar12.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_228,0x1f,LVar12,(this->m_stack).m_callbacks.m_user_data);
    if ((this->m_state->flags & 0x40) != 0) {
      uStack_218 = 0x6e6f6e5f7361;
      uStack_212 = 0x65;
      uStack_211 = 0x28;
      uStack_210 = 0x292959454b52;
      uStack_20a = 0;
      local_228.str = (char *)0x6166206b63656863;
      local_228.len._0_6_ = 0x203a64656c69;
      local_228.len._6_1_ = 0x28;
      local_228.len._7_1_ = 0x68;
      if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
        pcVar2 = (code *)swi(3);
        uVar17 = (*pcVar2)();
        return (bool)uVar17;
      }
      local_1c0 = 0;
      uStack_1b8 = 0x70c8;
      local_1b0 = 0;
      pcStack_1a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_1a0 = 0x65;
      LVar13.super_LineCol.col = 0;
      LVar13.super_LineCol.offset = SUB168(ZEXT816(0x70c8) << 0x40,0);
      LVar13.super_LineCol.line = SUB168(ZEXT816(0x70c8) << 0x40,8);
      LVar13.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar13.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_228,0x1f,LVar13,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  local_1e8.str = (char *)0x0;
  local_1e8.len = 0;
  bVar16 = _scan_scalar_map_blck(this,&local_1e8,&local_239);
  sVar22 = local_238.len;
  if (!bVar16) {
    if (((1 < local_238.len) && (*local_238.str == '-')) && (local_238.str[1] == ' ')) {
      this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
      _push_level(this,false);
      _move_scalar_from_top(this);
      _start_seq(this,true);
      _save_indentation(this,0);
LAB_0021c74e:
      sVar22 = 2;
      goto LAB_0021ce04;
    }
    iVar18 = basic_substring<const_char>::compare(&local_238,'-');
    if (iVar18 == 0) {
      _push_level(this,false);
      _move_scalar_from_top(this);
      _save_indentation(this,0);
    }
    else {
      if (sVar22 == 0) {
LAB_0021c916:
        bVar16 = _handle_types(this);
        if (bVar16) {
          return true;
        }
        bVar16 = _handle_val_anchors_and_refs(this);
        sVar22 = local_238.len;
        pcVar23 = local_238.str;
        if (bVar16) {
          return true;
        }
        if (3 < local_238.len) {
          lVar21 = 0;
          do {
            if (local_238.str[lVar21] != "--- "[lVar21]) {
              iVar18 = basic_substring<const_char>::compare(&local_238,"---",3);
              if (iVar18 != 0) {
                lVar21 = 0;
                goto LAB_0021ce7a;
              }
              break;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != 4);
          goto LAB_0021cf60;
        }
        iVar18 = basic_substring<const_char>::compare(&local_238,"---",3);
        pcVar23 = local_238.str;
        if (iVar18 == 0) goto LAB_0021cf60;
LAB_0021c963:
        if (2 < sVar22) {
          lVar21 = 0;
          do {
            if (local_238.str[lVar21] != "\t..."[lVar21 + 1]) goto LAB_0021c96d;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
          goto LAB_0021cf43;
        }
LAB_0021c96d:
        bVar16 = is_debugger_attached();
        if ((bVar16) && (bVar16 = is_debugger_attached(), bVar16)) {
          pcVar2 = (code *)swi(3);
          uVar17 = (*pcVar2)();
          return (bool)uVar17;
        }
        goto LAB_0021c980;
      }
      cVar1 = *local_238.str;
      if (cVar1 == ' ') {
        sVar22 = basic_substring<const_char>::first_not_of(&local_238,' ',0);
        if ((sVar22 != 0xffffffffffffffff) && (local_238.len < sVar22)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar16 = is_debugger_attached(), bVar16)) {
            pcVar2 = (code *)swi(3);
            uVar17 = (*pcVar2)();
            return (bool)uVar17;
          }
          handle_error(0x24bbea,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar22 == 0xffffffffffffffff) {
          local_228.str = local_238.str;
          local_228.len._0_6_ = (undefined6)local_238.len;
          local_228.len._6_1_ = (undefined1)(local_238.len >> 0x30);
          local_228.len._7_1_ = (undefined1)(local_238.len >> 0x38);
        }
        else {
          basic_substring<const_char>::basic_substring(&local_228,local_238.str,sVar22);
        }
        sVar22 = CONCAT17(local_228.len._7_1_,
                          CONCAT16(local_228.len._6_1_,(undefined6)local_228.len));
        goto LAB_0021ce04;
      }
      if (cVar1 == '{') {
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        _push_level(this,true);
        _move_scalar_from_top(this);
        _start_map(this,true);
        this->m_state->flags = this->m_state->flags & 0xffffff2fU | 0x50;
      }
      else {
        if (cVar1 != '[') goto LAB_0021c916;
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        _push_level(this,true);
        _move_scalar_from_top(this);
        _start_seq(this,true);
        this->m_state->flags = this->m_state->flags | 0x10;
      }
    }
LAB_0021cdfc:
    sVar22 = 1;
LAB_0021ce04:
    _line_progressed(this,sVar22);
    return true;
  }
  pSVar19 = this->m_state;
  local_238.str = (pSVar19->line_contents).rem.str;
  local_238.len = (pSVar19->line_contents).rem.len;
  if (local_238.len < 2) {
    if (local_238.len != 0) goto LAB_0021c86b;
  }
  else {
    if ((*local_238.str == ':') && (local_238.str[1] == ' ')) {
      pSVar19->flags = pSVar19->flags & 0xffffff3fU | 0x40;
      _push_level(this,false);
      _move_scalar_from_top(this);
      _move_val_anchor_to_key_anchor(this);
      _start_map(this,true);
      _save_indentation(this,this->m_state->scalar_col);
      this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
      goto LAB_0021c74e;
    }
LAB_0021c86b:
    if (*local_238.str == ':') {
      pSVar19->flags = pSVar19->flags & 0xffffff3fU | 0x40;
      _push_level(this,false);
      _move_scalar_from_top(this);
      _move_val_anchor_to_key_anchor(this);
      _start_map(this,true);
      _save_indentation(this,local_1e8.len);
      this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
      goto LAB_0021cdfc;
    }
  }
  val.len = local_1e8.len;
  val.str = local_1e8.str;
  _append_key_val(this,val,(uint)local_239);
  pSVar19 = this->m_state;
  uVar20 = pSVar19->flags & 0xffffff3fU | 0x40;
LAB_0021c9e2:
  pSVar19->flags = uVar20;
  return true;
  while (lVar21 = lVar21 + 1, pcVar23 = local_238.str, lVar21 != 3) {
LAB_0021ce9e:
    if (local_238.str[lVar21] != "---"[lVar21]) goto LAB_0021c817;
  }
  goto LAB_0021cf60;
  while (lVar21 = lVar21 + 1, lVar21 != 4) {
LAB_0021ce7a:
    if (pcVar23[lVar21] != "---\t"[lVar21]) goto LAB_0021c963;
  }
LAB_0021cf60:
  rem.len = sVar22;
  rem.str = pcVar23;
  _start_new_doc(this,rem);
  return true;
}

Assistant:

bool Parser::_handle_map_blck()
{
    _c4dbgpf("handle_map_blck: node_id={}  level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RMAP));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }

    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        // actually, we don't need RNXT in indent-based maps.
        addrem_flags(RKEY, RNXT);
    }

    if(_handle_indentation())
    {
        _c4dbgp("indentation token");
        return true;
    }

    if(has_any(RKEY))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        _c4dbgp("RMAP|RKEY read scalar?");
        bool is_quoted;
        if(_scan_scalar_map_blck(&rem, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");
            if(has_all(QMRK|SSCL))
            {
                _c4dbgpf("current key is QMRK; SSCL is set. so take store scalar='{}' as key and add an empty val", m_state->scalar);
                _append_key_val_null(rem.str - 1);
            }
            _store_scalar(rem, is_quoted);
            if(has_all(QMRK|RSET))
            {
                _c4dbgp("it's a complex key, so use null value '~'");
                _append_key_val_null(rem.str);
            }
            rem = m_state->line_contents.rem;

            if(rem.begins_with(':'))
            {
                _c4dbgp("wait for val");
                addrem_flags(RVAL, RKEY|QMRK);
                _line_progressed(1);
                rem = m_state->line_contents.rem;
                if(rem.begins_with_any(" \t"))
                {
                    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                    rem = rem.left_of(rem.first_not_of(" \t"));
                    _c4dbgpf("skip {} spaces/tabs", rem.len);
                    _line_progressed(rem.len);
                }
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            size_t pos = rem.first_not_of(" \t");
            if(pos == npos)
                pos = rem.len;
            _c4dbgpf("skip {} spaces/tabs", pos);
            _line_progressed(pos);
            return true;
        }
        else if(rem == '?' || rem.begins_with("? "))
        {
            _c4dbgp("it's a complex key");
            _line_progressed(rem.begins_with("? ") ? 2u : 1u);
            if(has_any(SSCL))
                _append_key_val_null(rem.str - 1);
            add_flags(QMRK);
            return true;
        }
        else if(has_all(QMRK) && rem.begins_with(':'))
        {
            _c4dbgp("complex key finished");
            if(!has_any(SSCL))
                _store_scalar_null(rem.str);
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(1);
            rem = m_state->line_contents.rem;
            if(rem.begins_with(' '))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                _skipchars(' ');
            }
            return true;
        }
        else if(rem == ':' || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgp("key finished");
            if(!has_all(SSCL))
            {
                _c4dbgp("key was empty...");
                _store_scalar_null(rem.str);
                rem_flags(QMRK);
            }
            addrem_flags(RVAL, RKEY);
            _line_progressed(rem == ':' ? 1 : 2);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("start new document '---'");
            _start_new_doc(rem);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));

        _c4dbgp("RMAP|RVAL read scalar?");
        csubstr s;
        bool is_quoted;
        if(_scan_scalar_map_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;

            if(rem.begins_with(": "))
            {
                _c4dbgp("actually, the scalar is the first key of a map");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(m_state->scalar_col);
                addrem_flags(RVAL, RKEY);
                _line_progressed(2);
            }
            else if(rem.begins_with(':'))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(/*behind*/s.len);
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending keyval to current map");
                _append_key_val(s, is_quoted);
                addrem_flags(RKEY, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("val is a nested seq, indented");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level();
            _move_scalar_from_top();
            _start_seq();
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("maybe a seq. start unknown, indented");
            _start_unk();
            _save_indentation();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with("--- ") || rem == "---" || rem.begins_with("---\t"))
        {
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return false;
}